

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O0

XXH128_hash_t
XXH3_hashLong_128b_internal
          (void *input,size_t len,xxh_u8 *secret,size_t secretSize,XXH3_f_accumulate_512 f_acc512,
          XXH3_f_scrambleAcc f_scramble)

{
  XXH128_hash_t XVar1;
  XXH64_hash_t XVar2;
  XXH64_hash_t XVar3;
  XXH3_f_scrambleAcc in_RCX;
  xxh_u64 *in_R9;
  xxh_u64 acc [8];
  XXH128_hash_t h128;
  undefined1 *start;
  xxh_u8 *in_stack_ffffffffffffff78;
  xxh_u64 *in_stack_ffffffffffffff80;
  XXH3_f_accumulate_512 in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffa0;
  xxh_u8 *in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb0;
  xxh_u8 *in_stack_ffffffffffffffb8;
  
  memcpy(&stack0xffffffffffffff78,&DAT_00126a40,0x40);
  XXH3_hashLong_internal_loop
            (in_R9,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
             in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_RCX);
  start = &stack0xffffffffffffff78;
  XVar2 = XXH3_mergeAccs(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,(xxh_u64)start);
  XVar3 = XXH3_mergeAccs(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,(xxh_u64)start);
  XVar1.high64 = XVar3;
  XVar1.low64 = XVar2;
  return XVar1;
}

Assistant:

XXH_FORCE_INLINE XXH128_hash_t XXH3_hashLong_128b_internal(
    const void* XXH_RESTRICT input, size_t len,
    const xxh_u8* XXH_RESTRICT secret, size_t secretSize,
    XXH3_f_accumulate_512 f_acc512, XXH3_f_scrambleAcc f_scramble) {
  XXH_ALIGN(XXH_ACC_ALIGN) xxh_u64 acc[XXH_ACC_NB] = XXH3_INIT_ACC;

  XXH3_hashLong_internal_loop(acc, (const xxh_u8*)input, len, secret,
                              secretSize, f_acc512, f_scramble);

  /* converge into final hash */
  XXH_STATIC_ASSERT(sizeof(acc) == 64);
  XXH_ASSERT(secretSize >= sizeof(acc) + XXH_SECRET_MERGEACCS_START);
  {
    XXH128_hash_t h128;
    h128.low64 = XXH3_mergeAccs(acc, secret + XXH_SECRET_MERGEACCS_START,
                                (xxh_u64)len * XXH_PRIME64_1);
    h128.high64 = XXH3_mergeAccs(
        acc, secret + secretSize - sizeof(acc) - XXH_SECRET_MERGEACCS_START,
        ~((xxh_u64)len * XXH_PRIME64_2));
    return h128;
  }
}